

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::UdpPortDeclSyntax::isKind(SyntaxKind kind)

{
  return kind - UdpInputPortDecl < 2;
}

Assistant:

bool UdpPortDeclSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UdpInputPortDecl:
        case SyntaxKind::UdpOutputPortDecl:
            return true;
        default:
            return false;
    }
}